

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O2

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)

{
  quicly_sendbuf_vec_t *__ptr;
  code *pcVar1;
  long lVar2;
  size_t sVar3;
  
  lVar2 = 0;
  for (sVar3 = 0; __ptr = (sb->vecs).entries, sVar3 != (sb->vecs).size; sVar3 = sVar3 + 1) {
    pcVar1 = *(code **)(*(long *)((long)&__ptr->cb + lVar2) + 8);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)((long)&__ptr->cb + lVar2);
    }
    lVar2 = lVar2 + 0x18;
  }
  free(__ptr);
  return;
}

Assistant:

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)
{
    size_t i;

    for (i = 0; i != sb->vecs.size; ++i) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + i;
        if (vec->cb->discard_vec != NULL)
            vec->cb->discard_vec(vec);
    }
    free(sb->vecs.entries);
}